

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInput.cpp
# Opt level: O2

short __thiscall gr::GrBufferIStream::ReadShortFromFont(GrBufferIStream *this)

{
  ushort uVar1;
  ushort *puVar2;
  undefined4 *puVar3;
  
  puVar2 = (ushort *)this->m_pbNext;
  if (1 < (long)this->m_pbLim - (long)puVar2 || this->m_pbLim == (byte *)0x0) {
    uVar1 = *puVar2;
    this->m_pbNext = (byte *)(puVar2 + 1);
    return uVar1 << 8 | uVar1 >> 8;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0x80000001;
  __cxa_throw(puVar3,&GrResult::typeinfo,0);
}

Assistant:

short GrBufferIStream::ReadShortFromFont()
{
	short snInput;

    if (m_pbLim && 2 > m_pbLim - m_pbNext)
        THROW(kresReadFault);

    snInput = (m_pbNext[0] << 8) + m_pbNext[1];
	m_pbNext += 2;
	return snInput;
}